

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O2

void __thiscall
helics::EndpointInfo::checkInterfacesForIssues
          (EndpointInfo *this,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *issues)

{
  int iVar1;
  pointer pEVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  iterator __end4;
  iterator __begin4;
  pointer pEVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  Errors local_ac;
  set<helics::GlobalHandle,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
  handles;
  string local_78;
  string local_58;
  ulong local_38;
  
  if (this->targetedEndpoint == true) {
    if (((this->required == true) &&
        ((this->sourceInformation).
         super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->sourceInformation).
         super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
         ._M_impl.super__Vector_impl_data._M_finish)) &&
       ((this->targetInformation).
        super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->targetInformation).
        super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_78._M_dataplus._M_p._0_4_ = 0xfffffffe;
      handles._M_t._M_impl._0_8_ = (this->key)._M_dataplus._M_p;
      handles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (this->key)._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x2e;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&handles;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_58,(v11 *)"Endpoint {} is required but has no connections",fmt,args);
      std::
      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
      ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  *)issues,(Errors *)&local_78,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    iVar1 = this->requiredConnections;
    if (0 < (long)iVar1) {
      uVar3 = ((long)(this->targetInformation).
                     super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->targetInformation).
                    super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x48;
      pEVar6 = (this->sourceInformation).
               super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar2 = (this->sourceInformation).
               super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar4 = ((long)pEVar2 - (long)pEVar6) / 0x48;
      uVar5 = uVar4;
      if (uVar4 < uVar3) {
        uVar5 = uVar3;
      }
      if ((ulong)(long)iVar1 < uVar5) {
        if (iVar1 == 1) {
          local_78._M_dataplus._M_p._0_4_ = 0xfffffffe;
          handles._M_t._M_impl._0_8_ = (this->key)._M_dataplus._M_p;
          handles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (this->key)._M_string_length;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x42;
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)&handles;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_58,
                     (v11 *)"Endpoint {} is single source only but has more than one connection",
                     fmt_00,args_00);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)issues,(Errors *)&local_78,&local_58);
          this_00 = &local_58;
        }
        else {
          local_78._M_dataplus._M_p._0_4_ = 0xfffffffe;
          local_58._M_dataplus._M_p = (this->key)._M_dataplus._M_p;
          local_58._M_string_length = (this->key)._M_string_length;
          fmt_01.size_ = 0x41d;
          fmt_01.data_ = (char *)0x37;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)&local_58;
          local_58.field_2._M_allocated_capacity._0_4_ = iVar1;
          local_38 = uVar5;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&handles,
                     (v11 *)"Endpoint {} requires {} connections but has at least {}",fmt_01,args_01
                    );
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)issues,(Errors *)&local_78,(string *)&handles);
          this_00 = (string *)&handles;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
      else if (iVar1 != (int)uVar4 + (int)uVar3) {
        handles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &handles._M_t._M_impl.super__Rb_tree_header._M_header;
        handles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             handles._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        handles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        handles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        handles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             handles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (; pEVar6 != pEVar2; pEVar6 = pEVar6 + 1) {
          std::
          _Rb_tree<helics::GlobalHandle,helics::GlobalHandle,std::_Identity<helics::GlobalHandle>,std::less<helics::GlobalHandle>,std::allocator<helics::GlobalHandle>>
          ::_M_emplace_unique<helics::GlobalHandle_const&>
                    ((_Rb_tree<helics::GlobalHandle,helics::GlobalHandle,std::_Identity<helics::GlobalHandle>,std::less<helics::GlobalHandle>,std::allocator<helics::GlobalHandle>>
                      *)&handles,&pEVar6->id);
        }
        pEVar2 = (this->targetInformation).
                 super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pEVar6 = (this->targetInformation).
                      super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                      ._M_impl.super__Vector_impl_data._M_start; pEVar6 != pEVar2;
            pEVar6 = pEVar6 + 1) {
          std::
          _Rb_tree<helics::GlobalHandle,helics::GlobalHandle,std::_Identity<helics::GlobalHandle>,std::less<helics::GlobalHandle>,std::allocator<helics::GlobalHandle>>
          ::_M_emplace_unique<helics::GlobalHandle_const&>
                    ((_Rb_tree<helics::GlobalHandle,helics::GlobalHandle,std::_Identity<helics::GlobalHandle>,std::less<helics::GlobalHandle>,std::allocator<helics::GlobalHandle>>
                      *)&handles,&pEVar6->id);
        }
        if (this->requiredConnections !=
            (int)handles._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          local_ac = CONNECTION_FAILURE;
          local_58._M_dataplus._M_p = (this->key)._M_dataplus._M_p;
          local_58._M_string_length = (this->key)._M_string_length;
          local_38 = handles._M_t._M_impl.super__Rb_tree_header._M_node_count;
          fmt_02.size_ = 0x41d;
          fmt_02.data_ = (char *)0x33;
          args_02.field_1.values_ = in_R9.values_;
          args_02.desc_ = (unsigned_long_long)&local_58;
          local_58.field_2._M_allocated_capacity._0_4_ = this->requiredConnections;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_78,(v11 *)"Endpoint {} requires {} connections but has only {}",fmt_02,
                     args_02);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)issues,&local_ac,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
        }
        std::
        _Rb_tree<helics::GlobalHandle,_helics::GlobalHandle,_std::_Identity<helics::GlobalHandle>,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
        ::~_Rb_tree(&handles._M_t);
      }
    }
  }
  return;
}

Assistant:

void EndpointInfo::checkInterfacesForIssues(std::vector<std::pair<int, std::string>>& issues)
{
    if (!targetedEndpoint) {
        return;
    }
    if (required) {
        if (sourceInformation.empty() && targetInformation.empty()) {
            issues.emplace_back(helics::defs::Errors::CONNECTION_FAILURE,
                                fmt::format("Endpoint {} is required but has no connections", key));
        }
    }
    if (requiredConnections > 0) {
        auto max_connections = (std::max)(targetInformation.size(), sourceInformation.size());
        auto sum_connections = targetInformation.size() + sourceInformation.size();

        if (max_connections > static_cast<size_t>(requiredConnections)) {
            if (requiredConnections == 1) {
                issues.emplace_back(
                    helics::defs::Errors::CONNECTION_FAILURE,
                    fmt::format(
                        "Endpoint {} is single source only but has more than one connection", key));
            } else {
                issues.emplace_back(
                    helics::defs::Errors::CONNECTION_FAILURE,
                    fmt::format("Endpoint {} requires {} connections but has at least {}",
                                key,
                                requiredConnections,
                                max_connections));
            }
        } else {
            if (static_cast<std::int32_t>(sum_connections) != requiredConnections) {
                std::set<GlobalHandle> handles;
                for (const auto& src : sourceInformation) {
                    handles.emplace(src.id);
                }
                for (const auto& trg : targetInformation) {
                    handles.emplace(trg.id);
                }
                if (static_cast<std::int32_t>(handles.size()) != requiredConnections) {
                    issues.emplace_back(
                        helics::defs::Errors::CONNECTION_FAILURE,
                        fmt::format("Endpoint {} requires {} connections but has only {}",
                                    key,
                                    requiredConnections,
                                    handles.size()));
                }
            }
        }
    }
}